

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_strings.cpp
# Opt level: O0

void __thiscall unitStrings_invcube_Test::TestBody(unitStrings_invcube_Test *this)

{
  bool bVar1;
  precise_unit *un;
  char *message;
  uint64_t in_RCX;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  AssertHelper local_70;
  Message local_68 [3];
  undefined1 local_50 [8];
  AssertionResult gtest_ar;
  string res;
  precise_unit funit;
  unitStrings_invcube_Test *this_local;
  
  res.field_2._8_8_ =
       units::precise_unit::pow((precise_unit *)units::precise::us::rod,in_XMM0_Qa,in_XMM1_Qa);
  un = (precise_unit *)units::getDefaultFlags();
  units::to_string_abi_cxx11_
            ((string *)&gtest_ar.message_,(units *)(res.field_2._M_local_buf + 8),un,in_RCX);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[7],_nullptr>
            ((EqHelper *)local_50,"res","\"1/rd^3\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar.message_
             ,(char (*) [7])"1/rd^3");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_50);
  if (!bVar1) {
    testing::Message::Message(local_68);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_50);
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x137,message);
    testing::internal::AssertHelper::operator=(&local_70,local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    testing::Message::~Message(local_68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
  std::__cxx11::string::~string((string *)&gtest_ar.message_);
  return;
}

Assistant:

TEST(unitStrings, invcube)
{
    auto funit = precise::us::rod.pow(-3);
    auto res = to_string(funit);
    EXPECT_EQ(res, "1/rd^3");
}